

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::DisposableOwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_>::
disposeImpl(DisposableOwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_>
            *this,void *pointer)

{
  OwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_>::~OwnedBundle
            (&this->
              super_OwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_>);
  operator_delete(this,0x28);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override { delete this; }